

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslpresharedkeyauthenticator.cpp
# Opt level: O2

bool __thiscall
QSslPreSharedKeyAuthenticator::isEqual
          (QSslPreSharedKeyAuthenticator *this,QSslPreSharedKeyAuthenticator *other)

{
  QSslPreSharedKeyAuthenticatorPrivate *pQVar1;
  bool bVar2;
  
  pQVar1 = (other->d).d.ptr;
  if (*(QSslPreSharedKeyAuthenticatorPrivate **)this == pQVar1) {
    bVar2 = true;
  }
  else {
    bVar2 = ::operator==(&(*(QSslPreSharedKeyAuthenticatorPrivate **)this)->identityHint,
                         &pQVar1->identityHint);
    if ((bVar2) &&
       (bVar2 = ::operator==((QByteArray *)(*(long *)this + 0x20),&((other->d).d.ptr)->identity),
       bVar2)) {
      pQVar1 = (other->d).d.ptr;
      if ((*(int *)(*(long *)this + 0x38) == pQVar1->maximumIdentityLength) &&
         (bVar2 = ::operator==((QByteArray *)(*(long *)this + 0x40),&pQVar1->preSharedKey), bVar2))
      {
        return *(int *)(*(long *)this + 0x58) == ((other->d).d.ptr)->maximumPreSharedKeyLength;
      }
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool QSslPreSharedKeyAuthenticator::isEqual(const QSslPreSharedKeyAuthenticator &other) const
{
    return ((d == other.d) ||
            (d->identityHint == other.d->identityHint &&
             d->identity == other.d->identity &&
             d->maximumIdentityLength == other.d->maximumIdentityLength &&
             d->preSharedKey == other.d->preSharedKey &&
             d->maximumPreSharedKeyLength == other.d->maximumPreSharedKeyLength));
}